

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O3

int64_t __thiscall AutoFile::tell(AutoFile *this)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged == false) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar2,(error_code *)"AutoFile::tell: position unknown");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload._M_value;
  }
  __stack_chk_fail();
}

Assistant:

int64_t AutoFile::tell()
{
    if (!m_position.has_value()) throw std::ios_base::failure("AutoFile::tell: position unknown");
    return *m_position;
}